

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O2

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  size_t *psVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ParameterSet *pPVar10;
  value_handle vVar11;
  PolyConnectivity *pPVar12;
  bool bVar13;
  int iVar14;
  Index IVar15;
  Index IVar16;
  long lVar17;
  Scalar *pSVar18;
  Scalar *pSVar19;
  long lVar20;
  MeshDenoisingBase *pMVar21;
  size_t *psVar22;
  pointer *ppVVar23;
  int i_1;
  int i;
  long lVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  FaceIter FVar31;
  undefined1 local_590 [8];
  SparseMatrix<double,_0,_int> normalize_matrix;
  SparseMatrix<double,_0,_int> coef_matrix;
  SparseMatrix<double,_0,_int> weight_matrix;
  SparseMatrix<double,_0,_int> identity_matrix;
  BaseHandle local_478;
  BaseHandle local_474;
  SparseMatrix<double,_0,_int> matrix;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  double multiple_radius;
  double multiple_sigma_s;
  double sigma_r;
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  MatrixXd right_term;
  undefined1 local_110 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  Nested local_f0;
  uint local_e0;
  undefined4 uStack_dc;
  MatrixX3d filtered_normals_matrix;
  undefined1 local_c0 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> coef_triple;
  undefined1 auStack_88 [8];
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> weight_triple;
  int face_neighbor_index;
  int normal_iteration_number;
  int vertex_iteration_number;
  double smoothness;
  double local_50;
  PolyConnectivity *local_48;
  MeshDenoisingBase *local_40;
  bool local_31 [8];
  bool include_central_face;
  
  iVar14 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x28))(mesh);
  smoothness = (double)filtered_normals;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar14);
  pPVar10 = (this->super_MeshDenoisingBase).parameter_set_;
  local_40 = &this->super_MeshDenoisingBase;
  std::__cxx11::string::string
            ((string *)&matrix.m_data.m_allocatedSize,"Face Neighbor",
             (allocator *)
             &guided_normals.
              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar13 = ParameterSet::getValue
                     (pPVar10,(string *)&matrix.m_data.m_allocatedSize,
                      (int *)&weight_triple.
                              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
  if (bVar13) {
    pPVar10 = local_40->parameter_set_;
    std::__cxx11::string::string
              ((string *)&matrix.m_data.m_allocatedSize,"include central face",
               (allocator *)
               &guided_normals.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar13 = ParameterSet::getValue(pPVar10,(string *)&matrix.m_data.m_allocatedSize,local_31);
    std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
    if (bVar13) {
      pPVar10 = local_40->parameter_set_;
      std::__cxx11::string::string
                ((string *)&matrix.m_data.m_allocatedSize,"Multiple(* avg face dis.)",
                 (allocator *)
                 &guided_normals.
                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar13 = ParameterSet::getValue
                         (pPVar10,(string *)&matrix.m_data.m_allocatedSize,
                          (double *)
                          &all_guided_neighbor.
                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
      if (bVar13) {
        pPVar10 = local_40->parameter_set_;
        std::__cxx11::string::string
                  ((string *)&matrix.m_data.m_allocatedSize,"Multiple(* sigma_s)",
                   (allocator *)
                   &guided_normals.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar13 = ParameterSet::getValue
                           (pPVar10,(string *)&matrix.m_data.m_allocatedSize,&multiple_radius);
        std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
        if (bVar13) {
          pPVar10 = local_40->parameter_set_;
          std::__cxx11::string::string
                    ((string *)&matrix.m_data.m_allocatedSize,"(Global)Normal Iteration Num.",
                     (allocator *)
                     &guided_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar13 = ParameterSet::getValue
                             (pPVar10,(string *)&matrix.m_data.m_allocatedSize,
                              (int *)((long)&weight_triple.
                                             super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                             );
          std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
          if (bVar13) {
            pPVar10 = local_40->parameter_set_;
            std::__cxx11::string::string
                      ((string *)&matrix.m_data.m_allocatedSize,"sigma_r",
                       (allocator *)
                       &guided_normals.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar13 = ParameterSet::getValue
                               (pPVar10,(string *)&matrix.m_data.m_allocatedSize,&multiple_sigma_s);
            std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
            if (bVar13) {
              pPVar10 = local_40->parameter_set_;
              std::__cxx11::string::string
                        ((string *)&matrix.m_data.m_allocatedSize,"smoothness",
                         (allocator *)
                         &guided_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar13 = ParameterSet::getValue
                                 (pPVar10,(string *)&matrix.m_data.m_allocatedSize,
                                  (double *)&vertex_iteration_number);
              std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
              if (bVar13) {
                pPVar10 = local_40->parameter_set_;
                std::__cxx11::string::string
                          ((string *)&matrix.m_data.m_allocatedSize,"Vertex Iteration Num.",
                           (allocator *)
                           &guided_normals.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar13 = ParameterSet::getValue
                                   (pPVar10,(string *)&matrix.m_data.m_allocatedSize,
                                    &face_neighbor_index);
                std::__cxx11::string::~string((string *)&matrix.m_data.m_allocatedSize);
                if (bVar13) {
                  previous_normals.
                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  coef_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  auStack_88 = (undefined1  [8])0x0;
                  weight_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  weight_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_48 = (PolyConnectivity *)mesh;
                  IVar15 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  IVar16 = (**(code **)(*(long *)&(((Mesh *)&local_48->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))();
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&coef_matrix.m_data.m_allocatedSize,
                             IVar15,IVar16);
                  IVar15 = (**(code **)(*(long *)&(((Mesh *)&local_48->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))();
                  IVar16 = (**(code **)(*(long *)&(((Mesh *)&local_48->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))();
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)local_590,IVar15,IVar16);
                  IVar15 = (**(code **)(*(long *)&(((Mesh *)&local_48->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))();
                  IVar16 = (**(code **)(*(long *)&(((Mesh *)&local_48->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))();
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&weight_matrix.m_data.m_allocatedSize,
                             IVar15,IVar16);
                  Eigen::SparseMatrix<double,_0,_int>::setIdentity
                            ((SparseMatrix<double,_0,_int> *)&weight_matrix.m_data.m_allocatedSize);
                  pPVar12 = local_48;
                  if ((int)weight_triple.
                           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
                    local_50 = getRadius((GuidedMeshNormalFiltering *)local_40,
                                         (double)all_guided_neighbor.
                                                 super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (TriMesh *)local_48);
                  }
                  iVar14 = (**(code **)(*(long *)&(((Mesh *)&pPVar12->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(pPVar12);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)&range_and_mean_normal.
                               super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar14,
                           (allocator_type *)&matrix.m_data.m_allocatedSize);
                  getAllFaceNeighborGMNF
                            ((GuidedMeshNormalFiltering *)local_40,(TriMesh *)pPVar12,
                             (uint)((int)weight_triple.
                                         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) *
                             2,local_50,local_31[0],
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)&range_and_mean_normal.
                                 super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  iVar14 = (**(code **)(*(long *)&(((Mesh *)&pPVar12->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(pPVar12);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)&all_face_neighbor.
                               super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar14,
                           (allocator_type *)&matrix.m_data.m_allocatedSize);
                  pMVar21 = local_40;
                  getAllGuidedNeighborGMNF
                            ((GuidedMeshNormalFiltering *)local_40,(TriMesh *)pPVar12,
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)&all_face_neighbor.
                                 super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  MeshDenoisingBase::getFaceNormal
                            (pMVar21,(TriMesh *)pPVar12,
                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              *)smoothness);
                  iVar14 = (**(code **)(*(long *)&(((Mesh *)&pPVar12->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(pPVar12);
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)&sigma_r,(long)iVar14,
                             (allocator_type *)&matrix.m_data.m_allocatedSize);
                  iVar14 = (**(code **)(*(long *)&(((Mesh *)&pPVar12->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(pPVar12);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)local_110,(long)iVar14,
                           (allocator_type *)&matrix.m_data.m_allocatedSize);
                  iVar14 = (**(code **)(*(long *)&(((Mesh *)&pPVar12->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(pPVar12);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)local_c0,(long)iVar14,(allocator_type *)&matrix.m_data.m_allocatedSize
                          );
                  iVar14 = (**(code **)(*(long *)&(((Mesh *)&pPVar12->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(pPVar12);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,(long)iVar14,
                           (allocator_type *)&matrix.m_data.m_allocatedSize);
                  iVar14 = (**(code **)(*(long *)&(((Mesh *)&pPVar12->super_ArrayKernel)->
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  ).
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(pPVar12);
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)&solver.m_detPermR,(long)iVar14,
                           (allocator_type *)&matrix.m_data.m_allocatedSize);
                  normal_iteration_number = 0;
                  while( true ) {
                    pPVar12 = local_48;
                    if (weight_triple.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <=
                        normal_iteration_number) break;
                    pMVar21 = local_40;
                    MeshDenoisingBase::getFaceCentroid
                              (local_40,(TriMesh *)local_48,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)local_110);
                    dVar25 = getSigmaS((GuidedMeshNormalFiltering *)pMVar21,multiple_radius,
                                       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        *)local_110,(TriMesh *)pPVar12);
                    psVar1 = &identity_matrix.m_data.m_allocatedSize;
                    MeshDenoisingBase::getFaceArea
                              (local_40,(TriMesh *)pPVar12,
                               (vector<double,_std::allocator<double>_> *)&sigma_r);
                    MeshDenoisingBase::getFaceNormal
                              (local_40,(TriMesh *)pPVar12,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)local_c0);
                    psVar22 = psVar1;
                    std::
                    vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                    ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)psVar1,
                             (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)&solver.m_detPermR);
                    getGuidedNormals((GuidedMeshNormalFiltering *)psVar22,(TriMesh *)pPVar12,
                                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                      *)&all_face_neighbor.
                                         super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (vector<double,_std::allocator<double>_> *)&sigma_r,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)local_c0,
                                     (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                      *)psVar1,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)&face_area.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage);
                    std::
                    _Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                    ::~_Vector_base((_Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                     *)psVar1);
                    if (coef_triple.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (pointer)previous_normals.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      coef_triple.
                      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)previous_normals.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    }
                    if ((undefined1  [8])
                        weight_triple.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != auStack_88) {
                      weight_triple.
                      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_88;
                    }
                    join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_begin(local_48);
                    while( true ) {
                      FVar31 = OpenMesh::PolyConnectivity::faces_end(local_48);
                      vVar11.super_BaseHandle.idx_ =
                           right_term.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data._0_4_;
                      if (right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data._0_4_ == (BaseHandle)FVar31.hnd_.super_BaseHandle.idx_ &&
                          (mesh_ptr)
                          guided_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == FVar31.mesh_) break;
                      lVar17 = (long)(int)right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_data._0_4_;
                      dVar2 = face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[lVar17 * 3];
                      dVar3 = face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[lVar17 * 3 + 1];
                      dVar4 = face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[lVar17 * 3 + 2];
                      dVar5 = (((pointer)((long)local_110 + lVar17 * 0x18))->
                              super_VectorDataT<double,_3>).values_[0];
                      dVar6 = (((pointer)((long)local_110 + lVar17 * 0x18))->
                              super_VectorDataT<double,_3>).values_[1];
                      dVar7 = (((pointer)((long)local_110 + lVar17 * 0x18))->
                              super_VectorDataT<double,_3>).values_[2];
                      ppVVar23 = (pointer *)&matrix.m_data.m_allocatedSize;
                      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                      vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                             ppVVar23,(vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                       *)((&(range_and_mean_normal.
                                             super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            second)[lVar17 + -1].super_VectorDataT<double,_3>.
                                          values_ + 2));
                      dVar28 = 0.0;
                      for (lVar17 = 0;
                          lVar17 < (int)(solver._0_8_ - matrix.m_data.m_allocatedSize >> 2);
                          lVar17 = lVar17 + 1) {
                        iVar14 = *(int *)(matrix.m_data.m_allocatedSize + lVar17 * 4);
                        lVar20 = (long)iVar14;
                        dVar26 = dVar5 - (((pointer)((long)local_110 + lVar20 * 0x18))->
                                         super_VectorDataT<double,_3>).values_[0];
                        dVar29 = dVar6 - (((pointer)((long)local_110 + lVar20 * 0x18))->
                                         super_VectorDataT<double,_3>).values_[1];
                        dVar30 = dVar7 - (((pointer)((long)local_110 + lVar20 * 0x18))->
                                         super_VectorDataT<double,_3>).values_[2];
                        dVar27 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage[lVar20 * 3];
                        dVar8 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar20 * 3 + 1];
                        dVar9 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar20 * 3 + 2];
                        local_50 = GaussianWeight((GuidedMeshNormalFiltering *)ppVVar23,
                                                  SQRT(dVar30 * dVar30 +
                                                       dVar26 * dVar26 + dVar29 * dVar29),dVar25);
                        dVar27 = GaussianWeight((GuidedMeshNormalFiltering *)ppVVar23,
                                                SQRT((dVar4 - dVar9) * (dVar4 - dVar9) +
                                                     (dVar2 - dVar27) * (dVar2 - dVar27) +
                                                     (dVar3 - dVar8) * (dVar3 - dVar8)),
                                                multiple_sigma_s);
                        matrix._0_8_ = local_50 * *(double *)((long)sigma_r + lVar20 * 8) * dVar27;
                        local_478 = vVar11.super_BaseHandle.idx_;
                        ppVVar23 = &previous_normals.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        local_474.idx_ = iVar14;
                        local_50 = (double)matrix._0_8_;
                        std::
                        vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                        ::emplace_back<Eigen::Triplet<double,int>>
                                  ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                                    *)ppVVar23,(Triplet<double,_int> *)&local_478);
                        dVar28 = dVar28 + local_50;
                      }
                      matrix._0_8_ = 1.0 / dVar28;
                      local_478 = vVar11.super_BaseHandle.idx_;
                      local_474 = vVar11.super_BaseHandle.idx_;
                      std::
                      vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                      ::emplace_back<Eigen::Triplet<double,int>>
                                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                                  *)auStack_88,(Triplet<double,_int> *)&local_478);
                      std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ::~_Vector_base((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                       *)&matrix.m_data.m_allocatedSize);
                      OpenMesh::Iterators::
                      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                      ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)&guided_normals.
                                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                    }
                    matrix.m_data.m_allocatedSize =
                         (size_t)previous_normals.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    guided_normals.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)coef_triple.
                                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                    psVar1 = &matrix.m_data.m_allocatedSize;
                    ppVVar23 = &guided_normals.
                                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    Eigen::SparseMatrix<double,0,int>::
                    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
                              ((SparseMatrix<double,0,int> *)&coef_matrix.m_data.m_allocatedSize,
                               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                *)psVar1,
                               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                *)ppVVar23);
                    matrix.m_data.m_allocatedSize = (size_t)auStack_88;
                    guided_normals.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)weight_triple.
                                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                    Eigen::SparseMatrix<double,0,int>::
                    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
                              ((SparseMatrix<double,0,int> *)local_590,
                               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                *)psVar1,
                               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                *)ppVVar23);
                    psVar1 = &weight_matrix.m_data.m_allocatedSize;
                    Eigen::
                    SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                    ::
                    SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                              ((SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>
                                *)ppVVar23,(SparseMatrix<double,_0,_int> *)local_590,
                               (SparseMatrix<double,_0,_int> *)&coef_matrix.m_data.m_allocatedSize);
                    psVar22 = &matrix.m_data.m_allocatedSize;
                    Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator-
                              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>
                                *)psVar22,
                               (SparseMatrixBase<Eigen::SparseMatrix<double,0,int>> *)psVar1,
                               (SparseMatrixBase<Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>
                                *)ppVVar23);
                    Eigen::SparseMatrix<double,0,int>::
                    SparseMatrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::SparseMatrix<double,0,int>const,Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>const>>
                              ((SparseMatrix<double,0,int> *)&local_478,
                               (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>_>
                                *)psVar22);
                    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                              ((SparseMatrix<double,_0,_int> *)&solver.m_lastError);
                    local_e0 = local_e0 & 0xffffff00;
                    filtered_normals_matrix.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data.
                    _0_1_ = 0;
                    filtered_normals_matrix.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows
                         = (DenseIndex)&local_478;
                    Eigen::
                    SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>
                    ::
                    SparseSparseProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Transpose<Eigen::SparseMatrix<double,0,int>>const>,Eigen::SparseMatrix<double,0,int>>
                              ((SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>
                                *)ppVVar23,
                               (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Transpose<Eigen::SparseMatrix<double,_0,_int>_>_>
                                *)&stack0xffffffffffffff20,
                               (SparseMatrix<double,_0,_int> *)&local_478);
                    face_centroid.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(face_centroid._17_8_ << 8);
                    local_f0 = (Nested)psVar1;
                    psVar1 = &matrix.m_data.m_allocatedSize;
                    Eigen::
                    SparseMatrixBase<Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>>
                    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                                 *)psVar1,
                                (SparseMatrixBase<Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>>
                                 *)ppVVar23,
                                (SparseMatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                                 *)&face_centroid.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    Eigen::SparseMatrix<double,0,int>::
                    SparseMatrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::SparseMatrix<double,0,int>const>const>>
                              ((SparseMatrix<double,0,int> *)
                               &normalize_matrix.m_data.m_allocatedSize,
                               (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>_>
                                *)psVar1);
                    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                              ((SparseMatrix<double,_0,_int> *)&solver);
                    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                              ((SparseMatrix<double,_0,_int> *)&right_term);
                    iVar14 = (*(local_48->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])()
                    ;
                    matrix.m_data.m_allocatedSize =
                         CONCAT44(matrix.m_data.m_allocatedSize._4_4_,iVar14);
                    local_e0 = 3;
                    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
                              ((Matrix<double,_1,_1,0,_1,_1> *)
                               &guided_normals.
                                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (int *)&matrix.m_data.m_allocatedSize,(int *)&stack0xffffffffffffff20
                              );
                    lVar20 = 0;
                    lVar17 = 0;
                    while( true ) {
                      if ((int)(((long)previous_normals.
                                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)local_c0) /
                               0x18) <= lVar17) break;
                      local_50 = *(Scalar *)
                                  ((long)((VectorDataT<double,_3> *)local_c0)->values_ + lVar20);
                      pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
                                ::operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                                              *)ppVVar23,lVar17,0);
                      *pSVar18 = local_50;
                      local_50 = *(Scalar *)
                                  ((long)((VectorDataT<double,_3> *)local_c0)->values_ + lVar20 + 8)
                      ;
                      pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
                                ::operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                                              *)ppVVar23,lVar17,1);
                      *pSVar18 = local_50;
                      local_50 = *(Scalar *)
                                  ((long)((VectorDataT<double,_3> *)local_c0)->values_ +
                                  lVar20 + 0x10);
                      pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>
                                ::operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                                              *)ppVVar23,lVar17,2);
                      *pSVar18 = local_50;
                      lVar17 = lVar17 + 1;
                      lVar20 = lVar20 + 0x18;
                    }
                    solver._0_8_ = _vertex_iteration_number;
                    psVar1 = &matrix.m_data.m_allocatedSize;
                    matrix.m_data.m_allocatedSize = (size_t)ppVVar23;
                    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                    lazyAssign<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)ppVVar23,
                               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                *)psVar1);
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                              *)psVar1);
                    ppVVar23 = &face_centroid.
                                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    psVar22 = &normalize_matrix.m_data.m_allocatedSize;
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    analyzePattern((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                    *)psVar1,(MatrixType *)psVar22);
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    factorize((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                               *)psVar1,(MatrixType *)psVar22);
                    join_0x00000010_0x00000000_ =
                         (solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          )Eigen::
                           SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
                           solve<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                     ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                                       *)psVar1,
                                      (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &guided_normals.
                                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    Eigen::Matrix<double,-1,3,0,-1,3>::
                    Matrix<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                              ((Matrix<double,_1,3,0,_1,3> *)&stack0xffffffffffffff20,
                               (ReturnByValue<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                *)ppVVar23);
                    face_centroid.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)&stack0xffffffffffffff20;
                    Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::normalize
                              ((VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)ppVVar23);
                    lVar17 = *(long *)smoothness;
                    lVar24 = 0;
                    dVar25 = smoothness;
                    for (lVar20 = 0; lVar20 < (int)((*(long *)((long)dVar25 + 8) - lVar17) / 0x18);
                        lVar20 = lVar20 + 1) {
                      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::
                                operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1>
                                            *)&stack0xffffffffffffff20,lVar20,0);
                      dVar25 = smoothness;
                      *(Scalar *)(*(long *)smoothness + lVar24) = *pSVar19;
                      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::
                                operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1>
                                            *)&stack0xffffffffffffff20,lVar20,1);
                      *(Scalar *)(*(long *)dVar25 + 8 + lVar24) = *pSVar19;
                      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::
                                operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1>
                                            *)&stack0xffffffffffffff20,lVar20,2);
                      lVar17 = *(long *)dVar25;
                      *(Scalar *)(lVar17 + 0x10 + lVar24) = *pSVar19;
                      lVar24 = lVar24 + 0x18;
                    }
                    MeshDenoisingBase::updateVertexPosition
                              (local_40,(TriMesh *)local_48,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)smoothness,face_neighbor_index,false);
                    free((void *)CONCAT44(uStack_dc,local_e0));
                    Eigen::
                    SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                    ~SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                               *)&matrix.m_data.m_allocatedSize);
                    free(guided_normals.
                         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                              ((SparseMatrix<double,_0,_int> *)
                               &normalize_matrix.m_data.m_allocatedSize);
                    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                              ((SparseMatrix<double,_0,_int> *)&local_478);
                    normal_iteration_number = normal_iteration_number + 1;
                  }
                  std::
                  _Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::~_Vector_base((_Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                   *)&solver.m_detPermR);
                  std::
                  _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   *)&face_area.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   *)local_c0);
                  std::
                  _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   *)local_110);
                  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                            ((_Vector_base<double,_std::allocator<double>_> *)&sigma_r);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)&all_face_neighbor.
                                super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)&range_and_mean_normal.
                                super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&weight_matrix.m_data.m_allocatedSize);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)local_590);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&coef_matrix.m_data.m_allocatedSize);
                  std::
                  _Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ::~_Vector_base((_Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   *)auStack_88);
                  std::
                  _Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ::~_Vector_base((_Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   *)&previous_normals.
                                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Global)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    double smoothness;
    if(!parameter_set_->getValue(string("smoothness"), smoothness))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    std::vector< Eigen::Triplet<double> > coef_triple;
    std::vector< Eigen::Triplet<double> > weight_triple;
    Eigen::SparseMatrix<double> weight_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> normalize_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> identity_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    identity_matrix.setIdentity();

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // construct matrix
        coef_triple.clear();
        weight_triple.clear();

        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = guided_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];            
            double weight_sum = 0.0;
            for(int i = 0; i < (int)face_neighbor.size(); i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = guided_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];
                double spatial_weight = GaussianWeight((ci - cj).length(), sigma_s);
                double range_weight = GaussianWeight((ni - nj).length(), sigma_r);
                double weight = face_area[index_j] * spatial_weight * range_weight;
                coef_triple.push_back( Eigen::Triplet<double>(index_i, index_j, weight) );
                weight_sum += weight;
            }
            weight_triple.push_back( Eigen::Triplet<double>(index_i, index_i , 1.0 / weight_sum) );
        }
        weight_matrix.setFromTriplets(coef_triple.begin(), coef_triple.end());
        normalize_matrix.setFromTriplets(weight_triple.begin(), weight_triple.end());
        Eigen::SparseMatrix<double> matrix = identity_matrix - normalize_matrix * weight_matrix;
        Eigen::SparseMatrix<double> coef_matrix = (1 - smoothness) * matrix.transpose() * matrix + smoothness * identity_matrix;

        // construct right term
        Eigen::MatrixXd right_term((int)mesh.n_faces(), 3);
        for(int i = 0; i < (int)previous_normals.size(); i++)
        {
            right_term(i, 0) = previous_normals[i][0];
            right_term(i, 1) = previous_normals[i][1];
            right_term(i, 2) = previous_normals[i][2];
        }
        right_term = smoothness * right_term;

        // solve Ax = b
        Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
        solver.analyzePattern(coef_matrix);
        solver.factorize(coef_matrix);
        Eigen::MatrixX3d filtered_normals_matrix = solver.solve(right_term);
        filtered_normals_matrix.rowwise().normalize();
        for(int i = 0; i < (int)filtered_normals.size(); i++)
        {
            filtered_normals[i][0] = filtered_normals_matrix(i, 0);
            filtered_normals[i][1] = filtered_normals_matrix(i, 1);
            filtered_normals[i][2] = filtered_normals_matrix(i, 2);
        }
        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}